

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

LabelInstr * __thiscall Lowerer::EnsureEpilogueLabel(Lowerer *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar4;
  bool local_39;
  LabelInstr *epilogueLabel;
  Instr *exitPrevInstr;
  Lowerer *this_local;
  
  this_01 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x387e,"(!this->m_func->GetJITFunctionBody()->IsCoroutine())",
                       "!this->m_func->GetJITFunctionBody()->IsCoroutine()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = this->m_func->m_exitInstr->m_prev;
  IVar3 = IR::Instr::GetKind(this_00);
  local_39 = true;
  if (IVar3 != InstrKindLabel) {
    local_39 = IR::Instr::IsProfiledLabelInstr(this_00);
  }
  if (local_39 == false) {
    this_local = (Lowerer *)IR::LabelInstr::New(Label,this->m_func,false);
    (this_local->m_lowererMD).lowererMDArch.helperCallArgs[10] = (Opnd *)L"Epilogue";
    IR::Instr::InsertAfter(this_00,(Instr *)this_local);
  }
  else {
    this_local = (Lowerer *)IR::Instr::AsLabelInstr(this_00);
  }
  return (LabelInstr *)this_local;
}

Assistant:

IR::LabelInstr *
Lowerer::EnsureEpilogueLabel() const
{
    Assert(!this->m_func->GetJITFunctionBody()->IsCoroutine());
    IR::Instr* exitPrevInstr = this->m_func->m_exitInstr->m_prev;
    if (exitPrevInstr->IsLabelInstr())
    {
        return exitPrevInstr->AsLabelInstr();
    }
    else
    {
        IR::LabelInstr* epilogueLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        LABELNAMESET(epilogueLabel, "Epilogue");
        exitPrevInstr->InsertAfter(epilogueLabel);
        return epilogueLabel;
    }
}